

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildReg3
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot src1RegSlot,
          RegSlot src2RegSlot,ProfileId profileId)

{
  undefined1 *puVar1;
  StackSym *pSVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  RegSlot RVar6;
  BOOL BVar7;
  JITTimeFunctionBody *pJVar8;
  RegOpnd *pRVar9;
  IntConstOpnd *src1Opnd;
  IntConstOpnd *src2Opnd;
  Instr *instr;
  RegOpnd *this_00;
  RegOpnd *dstOpnd;
  JITTimeProfileInfo *this_01;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar10;
  JitProfilingInstr *this_02;
  JitProfilingInstr *pJVar11;
  ProfiledInstr *pPVar12;
  undefined6 in_register_00000032;
  uint uVar13;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_58;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  ProfileId local_32;
  ValueType arrayType;
  
  uVar13 = (uint)CONCAT62(in_register_00000032,newOpcode);
  if (uVar13 == 0xe0) {
    pJVar8 = Func::GetJITFunctionBody(this->m_func);
    uVar5 = JITTimeFunctionBody::GetInnerScopeCount(pJVar8);
    if (uVar5 <= dstRegSlot) {
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    pJVar8 = Func::GetJITFunctionBody(this->m_func);
    RVar6 = JITTimeFunctionBody::GetFirstInnerScopeReg(pJVar8);
    pRVar9 = BuildDstOpnd(this,dstRegSlot + RVar6,TyVar,false,false);
    src1Opnd = IR::IntConstOpnd::New((ulong)src1RegSlot,TyVar,this->m_func,false);
    src2Opnd = IR::IntConstOpnd::New((ulong)src2RegSlot,TyVar,this->m_func,false);
    instr = IR::Instr::New(NewScopeSlotsWithoutPropIds,&pRVar9->super_Opnd,&src1Opnd->super_Opnd,
                           &src2Opnd->super_Opnd,this->m_func);
    pRVar9 = IR::Opnd::AsRegOpnd(instr->m_dst);
    if ((pRVar9->m_sym->field_0x18 & 1) != 0) {
      pRVar9 = IR::Opnd::AsRegOpnd(instr->m_dst);
      puVar1 = &pRVar9->m_sym->field_0x18;
      *(uint *)puVar1 = *(uint *)puVar1 | 2;
    }
    AddInstr(this,instr,offset);
    return;
  }
  pRVar9 = BuildSrcOpnd(this,src1RegSlot,TyVar);
  this_00 = BuildSrcOpnd(this,src2RegSlot,TyVar);
  dstOpnd = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
  pSVar2 = dstOpnd->m_sym;
  uVar13 = uVar13 & 0xffff;
  if (newOpcode == IsIn && profileId != 0xffff) {
    local_32 = profileId;
    bVar3 = DoLoadInstructionArrayProfileInfo(this);
    if (bVar3) {
      this_01 = Func::GetReadOnlyProfileInfo(this->m_func);
      paVar10 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                JITTimeProfileInfo::GetLdElemInfo(this_01,profileId);
      local_34.field_0 = paVar10->field_0;
      bVar4 = *(byte *)((long)paVar10 + 5);
      bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_34.field_0);
      local_58 = paVar10;
      if ((bVar3) && (bVar3 = AllowNativeArrayProfileInfo(this), !bVar3)) {
        local_34.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetArrayTypeId((ValueType *)&local_34.field_0,TypeIds_Array);
        local_58 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                   new<Memory::JitArenaAllocator>(6,this->m_func->m_alloc,0x3d6ef4);
        *(undefined4 *)local_58 = *(undefined4 *)paVar10;
        local_58[2] = paVar10[2];
        local_58->field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_34;
      }
      bVar4 = bVar4 ^ 1;
      IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)local_34.field_0);
      BVar7 = Func::HasTry(this->m_func->topFunc);
      if ((BVar7 == 0) || (bVar3 = Func::DoOptimizeTry(this->m_func->topFunc), bVar3))
      goto LAB_00491b92;
    }
    else {
      bVar4 = 0;
    }
  }
  else {
    bVar4 = 0;
    if (profileId != 0xffff) {
      local_32 = profileId;
      local_58 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)0x0;
LAB_00491b92:
      bVar3 = Func::DoSimpleJitDynamicProfile(this->m_func);
      if (bVar3) {
        this_02 = IR::JitProfilingInstr::New
                            (newOpcode,&dstOpnd->super_Opnd,&pRVar9->super_Opnd,&this_00->super_Opnd
                             ,this->m_func);
        pJVar11 = IR::Instr::AsJitProfilingInstr(&this_02->super_Instr);
        pJVar11->profileId = local_32;
      }
      else {
        this_02 = (JitProfilingInstr *)
                  IR::ProfiledInstr::New
                            (newOpcode,&dstOpnd->super_Opnd,&pRVar9->super_Opnd,&this_00->super_Opnd
                             ,this->m_func);
        pPVar12 = IR::Instr::AsProfiledInstr((Instr *)this_02);
        if (newOpcode == IsIn) {
          (pPVar12->u).ldElemInfo = (LdElemInfo *)local_58;
        }
        else {
          *(uint *)&pPVar12->u = (uint)profileId;
        }
      }
      goto LAB_00491bfc;
    }
  }
  this_02 = (JitProfilingInstr *)
            IR::Instr::New(newOpcode,&dstOpnd->super_Opnd,&pRVar9->super_Opnd,&this_00->super_Opnd,
                           this->m_func);
LAB_00491bfc:
  AddInstr(this,&this_02->super_Instr,offset);
  if (((bVar4 & 1) != 0) && (bVar3 = DoBailOnNoProfile(this), bVar3)) {
    InsertBailOnNoProfile(this,&this_02->super_Instr);
  }
  if ((((newOpcode == LdInnerFrameDisplay) || (uVar13 == 0x21f)) || (uVar13 == 0x20f)) &&
     (uVar13 = *(uint *)&pSVar2->field_0x18, (uVar13 & 1) != 0)) {
    *(uint *)&pSVar2->field_0x18 = uVar13 | 2;
  }
  return;
}

Assistant:

void
IRBuilder::BuildReg3(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot,
                        Js::RegSlot src2RegSlot, Js::ProfileId profileId)
{
    IR::Instr *     instr;

    if (newOpcode == Js::OpCode::NewInnerScopeSlots)
    {
        if (dstRegSlot >= m_func->GetJITFunctionBody()->GetInnerScopeCount())
        {
            Js::Throw::FatalInternalError();
        }
        newOpcode = Js::OpCode::NewScopeSlotsWithoutPropIds;
        dstRegSlot += m_func->GetJITFunctionBody()->GetFirstInnerScopeReg();
        instr = IR::Instr::New(newOpcode, BuildDstOpnd(dstRegSlot),
                               IR::IntConstOpnd::New(src1RegSlot, TyVar, m_func),
                               IR::IntConstOpnd::New(src2RegSlot, TyVar, m_func),
                               m_func);
        if (instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)
        {
            instr->GetDst()->AsRegOpnd()->m_sym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);
        return;
    }

    IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(src1RegSlot);
    IR::RegOpnd *   src2Opnd = this->BuildSrcOpnd(src2RegSlot);
    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(dstRegSlot);
    StackSym *      dstSym = dstOpnd->m_sym;

    bool isProfiledInstr = (profileId != Js::Constants::NoProfileId);
    bool wasNotProfiled = false;
    const Js::LdElemInfo * ldElemInfo = nullptr;

    if (isProfiledInstr && newOpcode == Js::OpCode::IsIn)
    {
        if (!DoLoadInstructionArrayProfileInfo())
        {
            isProfiledInstr = false;
        }
        else
        {
            ldElemInfo = this->m_func->GetReadOnlyProfileInfo()->GetLdElemInfo(profileId);
            ValueType arrayType = ldElemInfo->GetArrayType();
            wasNotProfiled = !ldElemInfo->WasProfiled();

            if (arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
            {
                arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);

                // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the ProfiledInstr.
                Js::LdElemInfo *const newLdElemInfo = JitAnew(m_func->m_alloc, Js::LdElemInfo, *ldElemInfo);
                newLdElemInfo->arrayType = arrayType;
                ldElemInfo = newLdElemInfo;
            }

            src2Opnd->SetValueType(arrayType);

            if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
            {
                isProfiledInstr = false;
            }
        }
    }

    if (isProfiledInstr)
    {
        if (m_func->DoSimpleJitDynamicProfile())
        {
            instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            instr->AsJitProfilingInstr()->profileId = profileId;
        }
        else
        {
            instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            if (newOpcode == Js::OpCode::IsIn)
            {
                instr->AsProfiledInstr()->u.ldElemInfo = ldElemInfo;
            }
            else
            {
                instr->AsProfiledInstr()->u.profileId = profileId;
            }
        }
    }
    else
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
    }

    this->AddInstr(instr, offset);

    if (wasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
    
    switch (newOpcode)
    {
    case Js::OpCode::LdHandlerScope:
    case Js::OpCode::NewScopeSlotsWithoutPropIds:
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        break;

    case Js::OpCode::LdInnerFrameDisplay:
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        break;
    }
}